

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llstk.c
# Opt level: O0

void blt(DLword *dest68k,DLword *source68k,int nw)

{
  int local_1c;
  DLword *pDStack_18;
  int nw_local;
  DLword *source68k_local;
  DLword *dest68k_local;
  
  pDStack_18 = source68k + nw;
  source68k_local = dest68k + nw;
  local_1c = nw;
  while (source68k_local = source68k_local + -1, pDStack_18 = pDStack_18 + -1, local_1c != 0) {
    *(undefined2 *)((ulong)source68k_local ^ 2) = *(undefined2 *)((ulong)pDStack_18 ^ 2);
    local_1c = local_1c + -1;
  }
  return;
}

Assistant:

void blt(DLword *dest68k, DLword *source68k, int nw) {
  /******* OLD def ,
   Due to C compiler's bug, we can't use pre-decrement for val
    source68k += nw;
    dest68k += nw;
    while(nw)
    {
      GETWORD(--dest68k)= GETWORD(--source68k);
      nw--;
     }
  **** OLD def ****/
  source68k = source68k + nw - 1;
  dest68k = dest68k + nw - 1;
  while (nw--) { GETWORD(dest68k--) = GETWORD(source68k--); }
}